

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity,REF_DBL *min_del,REF_DBL *min_add)

{
  int iVar1;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar2;
  REF_INT local_13c;
  REF_INT local_12c;
  REF_DBL local_120;
  REF_DBL local_118;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL r1;
  REF_DBL r0;
  REF_INT seg;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL skip;
  REF_INT n_add;
  REF_INT n_del;
  REF_INT n;
  REF_INT face_node;
  REF_INT face;
  REF_DBL total_quality;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_40;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *min_add_local;
  REF_DBL *min_del_local;
  REF_CAVITY ref_cavity_local;
  
  ref_node_00 = ref_cavity->ref_grid->node;
  ref_cell_00 = ref_cavity->ref_grid->cell[8];
  iVar1 = ref_cavity->node;
  *min_del = -2.0;
  *min_add = -2.0;
  n_add = 0;
  total_quality = 1.0;
  _face_node = 0.0;
  local_40 = 0;
  while( true ) {
    if (ref_cavity->tet_list->n <= local_40) {
      if ((ref_cavity->debug != 0) && (0 < n_add)) {
        printf("- min %12.8f avg %12.8f n %d\n",total_quality,_face_node / (double)n_add,
               (ulong)(uint)n_add);
      }
      *min_del = total_quality;
      skip = n_add;
      n_add = 0;
      total_quality = 1.0;
      _face_node = 0.0;
      for (n = 0; n < ref_cavity->maxface; n = n + 1) {
        if (((-1 < n) && (n < ref_cavity->maxface)) && (ref_cavity->f2n[n * 3] != -1)) {
          ref_private_macro_code_rss_1 = 0;
          for (n_del = 0; n_del < 3; n_del = n_del + 1) {
            if (iVar1 == ref_cavity->f2n[n_del + n * 3]) {
              ref_private_macro_code_rss_1 = 1;
            }
          }
          if (ref_private_macro_code_rss_1 == 0) {
            for (n_del = 0; n_del < 3; n_del = n_del + 1) {
              nodes[(long)n_del + -2] = ref_cavity->f2n[n_del + n * 3];
            }
            nodes[1] = iVar1;
            r0._4_4_ = ref_node_tet_quality(ref_node_00,(REF_INT *)&quality,&min_quality);
            if (r0._4_4_ != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x95b,"ref_cavity_change",(ulong)r0._4_4_,"new qual");
              return r0._4_4_;
            }
            n_add = n_add + 1;
            _face_node = min_quality + _face_node;
            if (min_quality <= total_quality) {
              local_120 = min_quality;
            }
            else {
              local_120 = total_quality;
            }
            total_quality = local_120;
            r0._4_4_ = 0;
          }
        }
      }
      if ((ref_cavity->debug != 0) && (0 < n_add)) {
        printf("+ min %12.8f avg %12.8f n %d\n",total_quality,_face_node / (double)n_add,
               (ulong)(uint)n_add);
      }
      *min_add = total_quality;
      ref_private_macro_code_rss = n_add;
      if (ref_cavity->debug != 0) {
        printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n",*min_add,*min_del,
               *min_add - *min_del,(ulong)(uint)n_add,(ulong)(uint)skip);
      }
      if (ref_cavity->debug != 0) {
        for (r0._0_4_ = 0; r0._0_4_ < ref_cavity->maxseg; r0._0_4_ = r0._0_4_ + 1) {
          if (((-1 < r0._0_4_) && (r0._0_4_ < ref_cavity->maxseg)) &&
             ((ref_cavity->s2n[r0._0_4_ * 3] != -1 &&
              ((iVar1 != ref_cavity->s2n[r0._0_4_ * 3] &&
               (iVar1 != ref_cavity->s2n[r0._0_4_ * 3 + 1])))))) {
            if (ref_cavity->surf_node == -1) {
              local_12c = ref_cavity->node;
            }
            else {
              local_12c = ref_cavity->surf_node;
            }
            uVar2 = ref_node_ratio(ref_node_00,local_12c,ref_cavity->s2n[r0._0_4_ * 3],&r1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x974,"ref_cavity_change",(ulong)uVar2,"ratio");
              return uVar2;
            }
            if (ref_cavity->surf_node == -1) {
              local_13c = ref_cavity->node;
            }
            else {
              local_13c = ref_cavity->surf_node;
            }
            uVar2 = ref_node_ratio(ref_node_00,local_13c,ref_cavity->s2n[r0._0_4_ * 3 + 1],
                                   (REF_DBL *)&ref_private_macro_code_rss_4);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x977,"ref_cavity_change",(ulong)uVar2,"ratio");
              return uVar2;
            }
            printf("+ ratio %f %f\n",r1,_ref_private_macro_code_rss_4);
          }
        }
      }
      return 0;
    }
    ref_private_macro_code_rss_2 =
         ref_cell_nodes(ref_cell_00,ref_cavity->tet_list->value[local_40],(REF_INT *)&quality);
    if (ref_private_macro_code_rss_2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x93f,"ref_cavity_change",(ulong)(uint)ref_private_macro_code_rss_2,"cell");
      return ref_private_macro_code_rss_2;
    }
    seg = ref_node_tet_quality(ref_node_00,(REF_INT *)&quality,&min_quality);
    if (seg != 0) break;
    n_add = n_add + 1;
    _face_node = min_quality + _face_node;
    if (min_quality <= total_quality) {
      local_118 = min_quality;
    }
    else {
      local_118 = total_quality;
    }
    total_quality = local_118;
    local_40 = local_40 + 1;
    seg = 0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x940,
         "ref_cavity_change",(ulong)(uint)seg,"new qual");
  return seg;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity, REF_DBL *min_del,
                                     REF_DBL *min_add) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality, total_quality;
  REF_INT face, face_node, n, n_del, n_add;
  REF_BOOL skip;

  *min_del = -2.0;
  *min_add = -2.0;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("- min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_del = min_quality;
  n_del = n;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      nodes[face_node] = ref_cavity_f2n(ref_cavity, face_node, face);
    }
    nodes[3] = node;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("+ min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_add = min_quality;
  n_add = n;

  if (ref_cavity_debug(ref_cavity))
    printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n", *min_add, *min_del,
           *min_add - *min_del, n_add, n_del);

  if (ref_cavity_debug(ref_cavity)) {
    REF_INT seg;
    REF_DBL r0, r1;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 0, seg), &r0),
          "ratio");
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 1, seg), &r1),
          "ratio");
      printf("+ ratio %f %f\n", r0, r1);
    }
  }

  return REF_SUCCESS;
}